

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O2

void __thiscall blockfilter_tests::gcsfilter_test::test_method(gcsfilter_test *this)

{
  long lVar1;
  __node_base _Var2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  int iVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  __ireturn_type _Var6;
  check_type cVar7;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  Element element2;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  GCSFilter filter;
  ElementSet excluded_elements;
  ElementSet included_elements;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&included_elements._M_h);
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&excluded_elements._M_h);
  for (iVar5 = 0; iVar5 != 100; iVar5 = iVar5 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&filter,0x20,
               (allocator_type *)&element2);
    *(uchar *)filter.m_params.m_siphash_k0 = (uchar)iVar5;
    std::__detail::
    _Insert<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&included_elements,(value_type *)&filter);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&element2,0x20,
               (allocator_type *)&local_140);
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)iVar5;
    std::__detail::
    _Insert<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&excluded_elements,(value_type *)&element2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&element2);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  }
  element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT71(element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,10);
  element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(0x400,element2.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
  GCSFilter::GCSFilter(&filter,(Params *)&element2,&included_elements);
  for (_Var2 = included_elements._M_h._M_before_begin; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    local_118 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_110 = "";
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x24;
    file.m_begin = (iterator)&local_118;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg);
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)GCSFilter::Match(&filter,(Element *)(_Var2._M_nxt + 1));
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_178 = "filter.Match(element)";
    local_170 = "";
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_180 = "";
    pvVar3 = &DAT_00000001;
    pvVar4 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,(lazy_ostream *)&element2,1,0,WARN,_cVar7,(size_t)&local_188,0x24);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    _Var6 = std::__detail::
            _Insert_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&excluded_elements._M_h,(Element *)(_Var2._M_nxt + 1));
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x27;
    file_00.m_begin = (iterator)&local_198;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
               msg_00);
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)GCSFilter::MatchAny(&filter,(ElementSet *)&excluded_elements._M_h)
    ;
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_178 = "filter.MatchAny(excluded_elements)";
    local_170 = "";
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
    element2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_tests.cpp"
    ;
    local_1b0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,(lazy_ostream *)&element2,1,0,WARN,_cVar7,(size_t)&local_1b8,0x27);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    std::
    _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::erase(&excluded_elements._M_h,
            (_Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>)
            _Var6.first.
            super__Node_iterator_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
            ._M_cur);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&filter.m_encoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&excluded_elements._M_h);
  std::
  _Hashtable<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::__detail::_Identity,_std::equal_to<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ByteVectorHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&included_elements._M_h);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gcsfilter_test)
{
    GCSFilter::ElementSet included_elements, excluded_elements;
    for (int i = 0; i < 100; ++i) {
        GCSFilter::Element element1(32);
        element1[0] = i;
        included_elements.insert(std::move(element1));

        GCSFilter::Element element2(32);
        element2[1] = i;
        excluded_elements.insert(std::move(element2));
    }

    GCSFilter filter({0, 0, 10, 1 << 10}, included_elements);
    for (const auto& element : included_elements) {
        BOOST_CHECK(filter.Match(element));

        auto insertion = excluded_elements.insert(element);
        BOOST_CHECK(filter.MatchAny(excluded_elements));
        excluded_elements.erase(insertion.first);
    }
}